

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void calling_value_text_multiple_times(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  SourceLineInfo local_120;
  size_t len;
  char *str;
  char *str2;
  size_t len2;
  sqlite3_context *local_f0;
  BinaryExpr<char_*const_&,_char_*const_&> local_e8;
  AssertionHandler catchAssertionHandler;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
  local_e8.super_ITransientExpression.m_isBinaryExpression = true;
  local_e8.super_ITransientExpression.m_result = false;
  local_e8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_120.line = 0xd9;
  local_f0 = context;
  Catch::StringRef::StringRef
            (&local_40,
             "(duckdb_shell_sqlite3_value_type(argv[0]) == 1 || duckdb_shell_sqlite3_value_type(argv[0]) == 2 || duckdb_shell_sqlite3_value_type(argv[0]) == 3)"
            );
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_e8,&local_120,local_40,Normal);
  iVar1 = duckdb_shell_sqlite3_value_type(*argv);
  bVar4 = true;
  if (iVar1 != 1) {
    iVar1 = duckdb_shell_sqlite3_value_type(*argv);
    if (iVar1 != 2) {
      iVar1 = duckdb_shell_sqlite3_value_type(*argv);
      bVar4 = iVar1 == 3;
    }
  }
  local_e8.super_ITransientExpression._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_e8.super_ITransientExpression._vptr_ITransientExpression._1_7_,bVar4);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  str = (char *)duckdb_shell_sqlite3_value_text(*argv);
  local_e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
  local_e8.super_ITransientExpression.m_isBinaryExpression = true;
  local_e8.super_ITransientExpression.m_result = false;
  local_e8.super_ITransientExpression._10_6_ = 0;
  local_120.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_120.line = 0xdb;
  Catch::StringRef::StringRef(&local_50,"duckdb_shell_sqlite3_value_type(argv[0]) == 3");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_e8,&local_120,local_50,Normal);
  uVar2 = duckdb_shell_sqlite3_value_type(*argv);
  local_120.file = (char *)&len;
  len = CONCAT44(len._4_4_,uVar2);
  len2 = CONCAT44(len2._4_4_,3);
  Catch::ExprLhs<int_const&>::operator==
            ((BinaryExpr<const_int_&,_const_int_&> *)&local_e8,(ExprLhs<int_const&> *)&local_120,
             (int *)&len2);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_e8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_e8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  len = strlen(str);
  lVar3 = 10;
  while( true ) {
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar4) break;
    str2 = (char *)duckdb_shell_sqlite3_value_text();
    local_e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
    local_e8.super_ITransientExpression.m_isBinaryExpression = true;
    local_e8.super_ITransientExpression.m_result = false;
    local_e8.super_ITransientExpression._10_6_ = 0;
    local_120.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
    ;
    local_120.line = 0xe2;
    Catch::StringRef::StringRef(&local_60,"str == str2");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_e8,&local_120,local_60,Normal);
    local_120.file = (char *)&str;
    Catch::ExprLhs<char*const&>::operator==(&local_e8,(ExprLhs<char*const&> *)&local_120,&str2);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_e8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_e8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    len2 = strlen(str2);
    local_e8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
    local_e8.super_ITransientExpression.m_isBinaryExpression = true;
    local_e8.super_ITransientExpression.m_result = false;
    local_e8.super_ITransientExpression._10_6_ = 0;
    local_120.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
    ;
    local_120.line = 0xe4;
    Catch::StringRef::StringRef(&local_70,"len == len2");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_e8,&local_120,local_70,Normal);
    local_120.file = (char *)&len;
    Catch::ExprLhs<unsigned_long_const&>::operator==
              ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)&local_e8,
               (ExprLhs<unsigned_long_const&> *)&local_120,&len2);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_e8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_e8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  iVar1 = duckdb_shell_sqlite3_value_bytes(*argv);
  len = (size_t)iVar1;
  duckdb_shell_sqlite3_result_text(local_f0,str,len,0);
  return;
}

Assistant:

static void calling_value_text_multiple_times(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE((sqlite3_value_type(argv[0]) == SQLITE_INTEGER || sqlite3_value_type(argv[0]) == SQLITE_FLOAT ||
	         sqlite3_value_type(argv[0]) == SQLITE_TEXT));
	char *str = (char *)sqlite3_value_text(argv[0]);
	REQUIRE(sqlite3_value_type(argv[0]) == SQLITE_TEXT);
	auto len = strlen(str);
	size_t len2;
	char *str2;
	// calling sqlite3_value_text multiple times,  i.e., 10x
	for (size_t i = 0; i < 10; ++i) {
		str2 = (char *)sqlite3_value_text(argv[0]);
		REQUIRE(str == str2);
		len2 = strlen(str2);
		REQUIRE(len == len2);
	}
	len = sqlite3_value_bytes(argv[0]);
	sqlite3_result_text(context, str, len, nullptr);
}